

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::ast::HierarchicalReference::Element>::reallocateTo
          (SmallVectorBase<slang::ast::HierarchicalReference::Element> *this,size_type newCapacity)

{
  Element *__last;
  iterator ctx;
  Element *in_RSI;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> *in_RDI;
  pointer newData;
  
  __last = (Element *)operator_new(0x727266);
  begin(in_RDI);
  ctx = end(in_RDI);
  std::
  uninitialized_move<slang::ast::HierarchicalReference::Element*,slang::ast::HierarchicalReference::Element*>
            (in_RSI,__last,(Element *)in_RDI);
  cleanup(in_RDI,(EVP_PKEY_CTX *)ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }